

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<unsigned_long,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:57:51),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<unsigned_long,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:57:51),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<unsigned_long> depResult;
  NullableValue<kj::Exception> local_5a8;
  char local_448;
  size_t local_440;
  ExceptionOr<unsigned_long> local_438;
  Exception local_2c8;
  Exception local_170;
  
  local_5a8.isSet = false;
  local_448 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_5a8);
  if (local_5a8.isSet == true) {
    Exception::Exception(&local_2c8,&local_5a8.field_1.value);
    local_170.ownFile.content.ptr = local_2c8.ownFile.content.ptr;
    local_170.ownFile.content.size_ = local_2c8.ownFile.content.size_;
    local_170.ownFile.content.disposer = local_2c8.ownFile.content.disposer;
    local_2c8.ownFile.content.ptr = (char *)0x0;
    local_2c8.ownFile.content.size_ = 0;
    local_170.file = local_2c8.file;
    local_170.line = local_2c8.line;
    local_170.type = local_2c8.type;
    local_170.description.content.ptr = local_2c8.description.content.ptr;
    local_170.description.content.size_ = local_2c8.description.content.size_;
    local_2c8.description.content.ptr = (char *)0x0;
    local_2c8.description.content.size_ = 0;
    local_170.description.content.disposer = local_2c8.description.content.disposer;
    local_170.context.ptr.disposer = local_2c8.context.ptr.disposer;
    local_170.context.ptr.ptr = local_2c8.context.ptr.ptr;
    local_2c8.context.ptr.ptr = (Context *)0x0;
    memcpy(local_170.trace,local_2c8.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_438,&local_170);
    local_438.value.ptr.isSet = false;
    Exception::~Exception(&local_170);
    ExceptionOr<unsigned_long>::operator=((ExceptionOr<unsigned_long> *)output,&local_438);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_438);
    Exception::~Exception(&local_2c8);
  }
  else if (local_448 == '\x01') {
    local_438.value.ptr.field_1.value =
         anon_class_16_2_928cd080_for_func::operator()(&this->func,local_440);
    local_438.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_438.value.ptr.isSet = true;
    ExceptionOr<unsigned_long>::operator=((ExceptionOr<unsigned_long> *)output,&local_438);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_438);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_5a8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }